

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg_ctr.c
# Opt level: O0

int drbg_ctr_init(PROV_DRBG *drbg)

{
  int iVar1;
  EVP_CIPHER_CTX *pEVar2;
  char *func;
  PROV_DRBG *in_RDI;
  size_t keylen;
  PROV_DRBG_CTR *ctr;
  char *in_stack_ffffffffffffffe0;
  long *plVar3;
  
  plVar3 = (long *)in_RDI->data;
  if (plVar3[4] == 0) {
    ERR_new();
    ERR_set_debug((char *)in_RDI,(int)((ulong)plVar3 >> 0x20),in_stack_ffffffffffffffe0);
    ERR_set_error(0x39,0x9b,(char *)0x0);
    return 0;
  }
  iVar1 = EVP_CIPHER_get_key_length((EVP_CIPHER *)plVar3[4]);
  func = (char *)(long)iVar1;
  plVar3[5] = (long)func;
  if (*plVar3 == 0) {
    pEVar2 = EVP_CIPHER_CTX_new();
    *plVar3 = (long)pEVar2;
  }
  if (plVar3[1] == 0) {
    pEVar2 = EVP_CIPHER_CTX_new();
    plVar3[1] = (long)pEVar2;
  }
  if ((*plVar3 == 0) || (plVar3[1] == 0)) {
    ERR_new();
    ERR_set_debug((char *)in_RDI,(int)((ulong)plVar3 >> 0x20),func);
    ERR_set_error(0x39,0xc0100,(char *)0x0);
  }
  else {
    iVar1 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)*plVar3,(EVP_CIPHER *)plVar3[3],(ENGINE *)0x0,
                              (uchar *)0x0,(uchar *)0x0,1);
    if ((iVar1 == 0) ||
       (iVar1 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)plVar3[1],(EVP_CIPHER *)plVar3[4],(ENGINE *)0x0,
                                  (uchar *)0x0,(uchar *)0x0,1), iVar1 == 0)) {
      ERR_new();
      ERR_set_debug((char *)in_RDI,(int)((ulong)plVar3 >> 0x20),func);
      ERR_set_error(0x39,0xd0,(char *)0x0);
    }
    else {
      in_RDI->strength = (uint)((long)func << 3);
      in_RDI->seedlen = (size_t)(func + 0x10);
      if ((int)plVar3[6] == 0) {
LAB_003400d8:
        iVar1 = drbg_ctr_init_lengths(in_RDI);
        return iVar1;
      }
      if (plVar3[2] == 0) {
        pEVar2 = EVP_CIPHER_CTX_new();
        plVar3[2] = (long)pEVar2;
      }
      if (plVar3[2] == 0) {
        ERR_new();
        ERR_set_debug((char *)in_RDI,(int)((ulong)plVar3 >> 0x20),func);
        ERR_set_error(0x39,0xc0100,(char *)0x0);
      }
      else {
        iVar1 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)plVar3[2],(EVP_CIPHER *)plVar3[3],(ENGINE *)0x0,
                                  "",(uchar *)0x0,1);
        if (iVar1 != 0) goto LAB_003400d8;
        ERR_new();
        ERR_set_debug((char *)in_RDI,(int)((ulong)plVar3 >> 0x20),func);
        ERR_set_error(0x39,0xcd,(char *)0x0);
      }
    }
  }
  EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)*plVar3);
  EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)plVar3[1]);
  plVar3[1] = 0;
  *plVar3 = 0;
  return 0;
}

Assistant:

static int drbg_ctr_init(PROV_DRBG *drbg)
{
    PROV_DRBG_CTR *ctr = (PROV_DRBG_CTR *)drbg->data;
    size_t keylen;

    if (ctr->cipher_ctr == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_MISSING_CIPHER);
        return 0;
    }
    ctr->keylen = keylen = EVP_CIPHER_get_key_length(ctr->cipher_ctr);
    if (ctr->ctx_ecb == NULL)
        ctr->ctx_ecb = EVP_CIPHER_CTX_new();
    if (ctr->ctx_ctr == NULL)
        ctr->ctx_ctr = EVP_CIPHER_CTX_new();
    if (ctr->ctx_ecb == NULL || ctr->ctx_ctr == NULL) {
        ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    if (!EVP_CipherInit_ex(ctr->ctx_ecb,
                           ctr->cipher_ecb, NULL, NULL, NULL, 1)
        || !EVP_CipherInit_ex(ctr->ctx_ctr,
                              ctr->cipher_ctr, NULL, NULL, NULL, 1)) {
        ERR_raise(ERR_LIB_PROV, PROV_R_UNABLE_TO_INITIALISE_CIPHERS);
        goto err;
    }

    drbg->strength = keylen * 8;
    drbg->seedlen = keylen + 16;

    if (ctr->use_df) {
        /* df initialisation */
        static const unsigned char df_key[32] = {
            0x00, 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07,
            0x08, 0x09, 0x0a, 0x0b, 0x0c, 0x0d, 0x0e, 0x0f,
            0x10, 0x11, 0x12, 0x13, 0x14, 0x15, 0x16, 0x17,
            0x18, 0x19, 0x1a, 0x1b, 0x1c, 0x1d, 0x1e, 0x1f
        };

        if (ctr->ctx_df == NULL)
            ctr->ctx_df = EVP_CIPHER_CTX_new();
        if (ctr->ctx_df == NULL) {
            ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
            goto err;
        }
        /* Set key schedule for df_key */
        if (!EVP_CipherInit_ex(ctr->ctx_df,
                               ctr->cipher_ecb, NULL, df_key, NULL, 1)) {
            ERR_raise(ERR_LIB_PROV, PROV_R_DERIVATION_FUNCTION_INIT_FAILED);
            goto err;
        }
    }
    return drbg_ctr_init_lengths(drbg);

err:
    EVP_CIPHER_CTX_free(ctr->ctx_ecb);
    EVP_CIPHER_CTX_free(ctr->ctx_ctr);
    ctr->ctx_ecb = ctr->ctx_ctr = NULL;
    return 0;    
}